

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

ZSTD_CDict *
duckdb_zstd::ZSTD_createCDict_byReference(void *dict,size_t dictSize,int compressionLevel)

{
  ZSTD_customMem customMem;
  ZSTD_CDict *pZVar1;
  int iVar2;
  ZSTD_compressionParameters local_120;
  ZSTD_CCtx_params local_100;
  
  ZSTD_getCParams_internal
            (&local_120,compressionLevel,0xffffffffffffffff,dictSize,ZSTD_cpm_createCDict);
  switchD_004a0b15::default(&local_100,0,0xd8);
  local_100.fParams.contentSizeFlag = 1;
  local_100.cParams.windowLog = local_120.windowLog;
  local_100.cParams.chainLog = local_120.chainLog;
  local_100.cParams.targetLength = local_120.targetLength;
  local_100.cParams.strategy = local_120.strategy;
  local_100.customMem.customAlloc = (ZSTD_allocFunction)0x0;
  local_100.customMem.customFree = (ZSTD_freeFunction)0x0;
  local_100.customMem.opaque = (void *)0x0;
  customMem.opaque = (void *)0x0;
  customMem.customAlloc = (ZSTD_allocFunction)0x0;
  customMem.customFree = (ZSTD_freeFunction)0x0;
  pZVar1 = ZSTD_createCDict_advanced2
                     (dict,dictSize,ZSTD_dlm_byRef,ZSTD_dct_auto,&local_100,customMem);
  if (pZVar1 != (ZSTD_CDict *)0x0) {
    iVar2 = 3;
    if (compressionLevel != 0) {
      iVar2 = compressionLevel;
    }
    pZVar1->compressionLevel = iVar2;
  }
  return pZVar1;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_byReference(const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters cParams = ZSTD_getCParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    ZSTD_CDict* const cdict = ZSTD_createCDict_advanced(dict, dictSize,
                                     ZSTD_dlm_byRef, ZSTD_dct_auto,
                                     cParams, ZSTD_defaultCMem);
    if (cdict)
        cdict->compressionLevel = (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : compressionLevel;
    return cdict;
}